

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_markov_node.cpp
# Opt level: O0

void __thiscall gauss_markov_node::update(gauss_markov_node *this,double time)

{
  vec3 *pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 local_24;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c;
  double local_18;
  double time_local;
  gauss_markov_node *this_local;
  
  local_18 = time;
  time_local = (double)this;
  if (XMIN < (this->super_node).x) {
    if (XMAX <= (this->super_node).x) {
      (this->super_node).x = XMAX + XMAX + -(this->super_node).x;
      reflect(this,2);
    }
  }
  else {
    (this->super_node).x = XMIN + XMIN + -(this->super_node).x;
    reflect(this,1);
  }
  if (YMIN < (this->super_node).y) {
    if (YMAX <= (this->super_node).y) {
      (this->super_node).y = YMAX + YMAX + -(this->super_node).y;
      reflect(this,4);
    }
  }
  else {
    (this->super_node).y = YMIN + YMIN + -(this->super_node).y;
    reflect(this,3);
  }
  if (ZMIN < (this->super_node).z) {
    if (ZMAX <= (this->super_node).z) {
      (this->super_node).z = ZMAX + ZMAX + -(this->super_node).z;
      reflect(this,6);
    }
  }
  else {
    (this->super_node).z = ZMIN + ZMIN + -(this->super_node).z;
    reflect(this,5);
  }
  dVar2 = node::getv(&this->super_node);
  dVar3 = node::getd(&this->super_node);
  dVar3 = cos(dVar3);
  dVar4 = node::getp(&this->super_node);
  dVar4 = sin(dVar4);
  (this->super_node).x = dVar2 * dVar3 * dVar4 * local_18 + (this->super_node).x;
  dVar2 = node::getv(&this->super_node);
  dVar3 = node::getd(&this->super_node);
  dVar3 = sin(dVar3);
  dVar4 = node::getp(&this->super_node);
  dVar4 = sin(dVar4);
  (this->super_node).y = dVar2 * dVar3 * dVar4 * local_18 + (this->super_node).y;
  dVar2 = node::getv(&this->super_node);
  dVar3 = node::getp(&this->super_node);
  dVar3 = cos(dVar3);
  (this->super_node).z = dVar2 * dVar3 * local_18 + (this->super_node).z;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_24,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  pvVar1 = points + (this->super_node).id;
  pvVar1->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_24;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_24._4_4_;
  pvVar1->field_2 = local_1c;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  return;
}

Assistant:

void gauss_markov_node::update(double time){   //parameter time is in second
    if (this->x <= XMIN) {      //If gauss_markov_node hit the XMIN bound then reflect
        this->x = 2*XMIN - this->x;     //Fix out of bound bug: if OutOfBound then mirror
        reflect(1);
    }else if(this->x >= XMAX){  //If gauss_markov_node hit the XMAX bound then reflect
        this->x = 2*XMAX - this->x;
        reflect(2);
    }
    if (this->y <= YMIN) {
        this->y = 2*YMIN - this->y;
        reflect(3);
    } else if(this->y >= YMAX){
        this->y = 2*YMAX - this->y;
        reflect(4);
    }
    if (this->z <=ZMIN){
        this->z = 2*ZMIN - this->z;
        reflect(5);
    }else if(this->z >= ZMAX){
        this->z = 2*ZMAX - this->z;
        reflect(6);
    }
//    if(this->x >= (XMAX-xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.25*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.75*M_PI);
//        else this->setdmean(M_PI);
//    }else if(this->x <= (XMIN+xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.75*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.25*M_PI);
//        else this->setdmean(0);
//    }else {
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.5*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.5*M_PI);
//    }
    this->x += this->getv()*cos(this->getd())*sin(this->getp())*time;
    this->y += this->getv()*sin(this->getd())*sin(this->getp())*time;
    this->z += this->getv()*cos(this->getp())*time;
//    printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
//    series->dataProxy()->resetArray(points);
}